

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

iterator __thiscall
QMultiMap<QGraphicsItem_*,_QGraphicsItem_*>::insert
          (QMultiMap<QGraphicsItem_*,_QGraphicsItem_*> *this,QGraphicsItem **key,
          QGraphicsItem **value)

{
  bool bVar1;
  QMapData<std::multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>_>
  *pQVar2;
  QGraphicsItem **in_RDX;
  QGraphicsItem **in_RSI;
  long in_FS_OFFSET;
  iterator i;
  QMultiMap<QGraphicsItem_*,_QGraphicsItem_*> copy;
  multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>
  *in_stack_ffffffffffffff88;
  iterator it;
  QMultiMap<QGraphicsItem_*,_QGraphicsItem_*> *in_stack_ffffffffffffff90;
  pair<QGraphicsItem_*const,_QGraphicsItem_*> *this_00;
  const_iterator in_stack_ffffffffffffffa8;
  pair<QGraphicsItem_*const,_QGraphicsItem_*> local_38;
  _Rb_tree_const_iterator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_> local_28;
  iterator local_20;
  undefined1 *local_18;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>_>_>
          ::isShared(&in_stack_ffffffffffffff90->d);
  if (bVar1) {
    QMultiMap(in_stack_ffffffffffffff90,
              (QMultiMap<QGraphicsItem_*,_QGraphicsItem_*> *)in_stack_ffffffffffffff88);
  }
  else {
    memset(&local_18,0,8);
    QMultiMap((QMultiMap<QGraphicsItem_*,_QGraphicsItem_*> *)0x9de4f2);
  }
  detach(in_stack_ffffffffffffff90);
  local_20._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>_>_>
                *)0x9de515);
  local_20._M_node =
       (_Base_ptr)
       std::
       multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>
       ::lower_bound(in_stack_ffffffffffffff88,(key_type *)0x9de526);
  pQVar2 = QtPrivate::
           QExplicitlySharedDataPointerV2<QMapData<std::multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>_>_>
           ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>_>_>
                         *)0x9de535);
  it._M_node = (_Base_ptr)&pQVar2->m;
  std::_Rb_tree_const_iterator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>::
  _Rb_tree_const_iterator(&local_28,&local_20);
  this_00 = &local_38;
  std::pair<QGraphicsItem_*const,_QGraphicsItem_*>::
  pair<QGraphicsItem_*const,_QGraphicsItem_*,_true>(this_00,in_RSI,in_RDX);
  std::
  multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>
  ::insert((multimap<QGraphicsItem_*,_QGraphicsItem_*,_std::less<QGraphicsItem_*>,_std::allocator<std::pair<QGraphicsItem_*const,_QGraphicsItem_*>_>_>
            *)this_00,in_stack_ffffffffffffffa8,(value_type *)it._M_node);
  iterator::iterator((iterator *)0x9de58c,it);
  ~QMultiMap((QMultiMap<QGraphicsItem_*,_QGraphicsItem_*> *)0x9de596);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)(iterator)local_10._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator insert(const Key &key, const T &value)
    {
        const auto copy = d.isShared() ? *this : QMultiMap(); // keep `key`/`value` alive across the detach
        detach();
        // note that std::multimap inserts at the end of an equal_range for a key,
        // QMultiMap at the beginning.
        auto i = d->m.lower_bound(key);
        return iterator(d->m.insert(i, {key, value}));
    }